

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BrotliBuildAndStoreHuffmanTreeFast
               (MemoryManager *m,uint32_t *histogram,size_t histogram_total,size_t max_bits,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  HuffmanTree HVar2;
  byte bVar3;
  size_t sVar4;
  int iVar5;
  HuffmanTree *pool;
  HuffmanTree *pHVar6;
  ulong uVar7;
  size_t __n;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint64_t *puVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  byte bVar20;
  byte bVar21;
  long lVar22;
  uint uVar23;
  uint *puVar24;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  size_t local_50;
  MemoryManager *local_48;
  uint16_t *local_40;
  ulong local_38;
  
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  if (histogram_total == 0) {
    __n = 0;
    local_38 = 0;
  }
  else {
    local_38 = 0;
    __n = 0;
    do {
      uVar23 = histogram[__n];
      if ((ulong)uVar23 != 0) {
        if (local_38 < 4) {
          *(size_t *)(local_78 + local_38 * 8) = __n;
        }
        local_38 = local_38 + 1;
        histogram_total = histogram_total - uVar23;
      }
      __n = __n + 1;
    } while (histogram_total != 0);
  }
  if (local_38 < 2) {
    uVar13 = *storage_ix;
    uVar10 = uVar13 + 4;
    *(ulong *)(storage + (uVar13 >> 3)) = (ulong)storage[uVar13 >> 3] | 1L << ((byte)uVar13 & 7);
    *storage_ix = uVar10;
    *(ulong *)(storage + (uVar10 >> 3)) =
         local_78._0_8_ << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
    *storage_ix = uVar13 + max_bits + 4;
    depth[local_78._0_8_] = '\0';
    bits[local_78._0_8_] = 0;
  }
  else {
    local_50 = max_bits;
    local_40 = bits;
    memset(depth,0,__n);
    local_48 = m;
    pool = (HuffmanTree *)BrotliAllocate(m,__n << 4 | 8);
    uVar23 = 1;
    pHVar6 = pool;
    sVar4 = __n;
    do {
      for (; sVar4 != 0; sVar4 = sVar4 - 1) {
        uVar8 = histogram[sVar4 - 1];
        if (uVar8 != 0) {
          if (uVar8 <= uVar23) {
            uVar8 = uVar23;
          }
          pHVar6->total_count_ = uVar8;
          pHVar6->index_left_ = -1;
          pHVar6->index_right_or_value_ = (short)sVar4 + -1;
          pHVar6 = pHVar6 + 1;
        }
      }
      iVar5 = (int)((ulong)((long)pHVar6 - (long)pool) >> 3);
      uVar10 = (ulong)iVar5;
      if (uVar10 < 0xd) {
        if (1 < uVar10) {
          uVar13 = 1;
          do {
            HVar2 = pool[uVar13];
            uVar16 = uVar13;
            do {
              if (pool[uVar16 - 1].total_count_ <= HVar2.total_count_) goto LAB_00112b19;
              pool[uVar16] = pool[uVar16 - 1];
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
            uVar16 = 0;
LAB_00112b19:
            pool[uVar16] = HVar2;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar10);
        }
      }
      else {
        uVar13 = (ulong)((uint)(uVar10 < 0x39) * 2);
        do {
          uVar16 = *(ulong *)(SortHuffmanTreeItems_gaps + uVar13 * 8);
          if (uVar16 < uVar10) {
            lVar22 = 0;
            uVar7 = uVar16;
            do {
              HVar2 = pool[uVar7];
              uVar18 = uVar7;
              for (lVar17 = lVar22;
                  (uVar16 <= uVar18 &&
                  (HVar2.total_count_ < *(uint *)((long)&pool->total_count_ + lVar17)));
                  lVar17 = lVar17 + uVar16 * -8) {
                pool[uVar18] = *(HuffmanTree *)((long)&pool->total_count_ + lVar17);
                uVar18 = uVar18 - uVar16;
              }
              pool[uVar18] = HVar2;
              uVar7 = uVar7 + 1;
              lVar22 = lVar22 + 8;
            } while (uVar7 != uVar10);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != 6);
      }
      pHVar6->total_count_ = 0xffffffff;
      pHVar6->index_left_ = -1;
      pHVar6->index_right_or_value_ = -1;
      pHVar6[1].total_count_ = 0xffffffff;
      pHVar6[1].index_left_ = -1;
      pHVar6[1].index_right_or_value_ = -1;
      if (1 < iVar5) {
        iVar9 = iVar5 + 1;
        pHVar6 = pHVar6 + 2;
        iVar12 = iVar5 + 1;
        iVar14 = 0;
        do {
          uVar1 = pool[iVar14].total_count_;
          uVar8 = pool[iVar9].total_count_;
          iVar15 = iVar14;
          if (uVar8 < uVar1) {
            iVar15 = iVar9;
          }
          iVar14 = iVar14 + (uint)(uVar1 <= uVar8);
          iVar9 = iVar9 + (uint)(uVar8 < uVar1);
          uVar1 = pool[iVar14].total_count_;
          uVar8 = pool[iVar9].total_count_;
          iVar19 = iVar14;
          if (uVar8 < uVar1) {
            iVar19 = iVar9;
          }
          iVar14 = iVar14 + (uint)(uVar1 <= uVar8);
          iVar9 = iVar9 + (uint)(uVar8 < uVar1);
          pHVar6[-1].total_count_ = pool[iVar19].total_count_ + pool[iVar15].total_count_;
          pHVar6[-1].index_left_ = (int16_t)iVar15;
          pHVar6[-1].index_right_or_value_ = (int16_t)iVar19;
          pHVar6->total_count_ = 0xffffffff;
          pHVar6->index_left_ = -1;
          pHVar6->index_right_or_value_ = -1;
          pHVar6 = pHVar6 + 1;
          iVar12 = iVar12 + -1;
        } while (2 < iVar12);
      }
      iVar5 = BrotliSetDepth(iVar5 * 2 + -1,pool,depth,0xe);
      uVar23 = uVar23 * 2;
      pHVar6 = pool;
      sVar4 = __n;
    } while (iVar5 == 0);
    BrotliFree(local_48,pool);
    BrotliConvertBitDepthsToSymbols(depth,__n,local_40);
    if (local_38 < 5) {
      uVar13 = *storage_ix;
      *(ulong *)(storage + (uVar13 >> 3)) = (ulong)storage[uVar13 >> 3] | 1L << ((byte)uVar13 & 7);
      uVar10 = uVar13 + 2;
      *storage_ix = uVar10;
      *(ulong *)(storage + (uVar10 >> 3)) =
           local_38 - 1 << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
      uVar13 = uVar13 + 4;
      *storage_ix = uVar13;
      uVar10 = 0;
      do {
        uVar7 = uVar10 + 1;
        for (uVar16 = uVar7; uVar16 < local_38; uVar16 = uVar16 + 1) {
          lVar22 = *(long *)(local_78 + uVar16 * 8);
          if (depth[lVar22] < depth[*(long *)(local_78 + uVar10 * 8)]) {
            *(long *)(local_78 + uVar16 * 8) = *(long *)(local_78 + uVar10 * 8);
            *(long *)(local_78 + uVar10 * 8) = lVar22;
          }
        }
        uVar10 = uVar7;
      } while (uVar7 != local_38);
      uVar18 = local_78._0_8_ << ((byte)uVar13 & 7);
      uVar7 = uVar13 >> 3;
      uVar13 = uVar13 + local_50;
      uVar16 = uVar13 >> 3;
      bVar20 = (byte)uVar13;
      uVar10 = uVar13 + local_50;
      if (local_38 == 3) {
        *(ulong *)(storage + uVar7) = uVar18 | storage[uVar7];
        *storage_ix = uVar13;
        *(ulong *)(storage + uVar16) = local_78._8_8_ << (bVar20 & 7) | (ulong)storage[uVar16];
        *storage_ix = uVar10;
        *(ulong *)(storage + (uVar10 >> 3)) =
             local_68._0_8_ << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
        *storage_ix = local_50 + uVar10;
      }
      else {
        if (local_38 == 2) {
          *(ulong *)(storage + uVar7) = uVar18 | storage[uVar7];
          *storage_ix = uVar13;
          *(ulong *)(storage + uVar16) = local_78._8_8_ << (bVar20 & 7) | (ulong)storage[uVar16];
        }
        else {
          *(ulong *)(storage + uVar7) = uVar18 | storage[uVar7];
          *storage_ix = uVar13;
          *(ulong *)(storage + uVar16) = local_78._8_8_ << (bVar20 & 7) | (ulong)storage[uVar16];
          *storage_ix = uVar10;
          *(ulong *)(storage + (uVar10 >> 3)) =
               local_68._0_8_ << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
          uVar10 = uVar10 + local_50;
          *storage_ix = uVar10;
          *(ulong *)(storage + (uVar10 >> 3)) =
               local_68._8_8_ << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
          uVar13 = uVar10 + local_50;
          *storage_ix = uVar13;
          *(ulong *)(storage + (uVar13 >> 3)) =
               (ulong)(depth[local_78._0_8_] == '\x01') << ((byte)uVar13 & 7) |
               (ulong)storage[uVar13 >> 3];
          uVar10 = uVar10 + local_50 + 1;
        }
        *storage_ix = uVar10;
      }
    }
    else {
      uVar10 = *storage_ix;
      *(ulong *)(storage + (uVar10 >> 3)) =
           0xff55555554 << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
      *storage_ix = uVar10 + 0x28;
      if (__n != 0) {
        uVar10 = 0;
        bVar20 = 8;
        do {
          bVar21 = depth[uVar10];
          uVar16 = 1;
          uVar13 = uVar16;
          if (uVar10 + 1 < __n) {
            do {
              uVar13 = uVar16;
              if (depth[uVar16 + uVar10] != bVar21) break;
              uVar16 = uVar16 + 1;
              uVar13 = __n - uVar10;
            } while (__n - uVar10 != uVar16);
          }
          if (bVar21 == 0) {
            puVar24 = kZeroRepsDepth + uVar13;
            puVar11 = kZeroRepsBits + uVar13;
LAB_00112f17:
            uVar16 = *storage_ix;
            uVar7 = *puVar24 + uVar16;
            *(uint64_t *)(storage + (uVar16 >> 3)) =
                 *puVar11 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
            bVar21 = bVar20;
LAB_00112f3f:
            *storage_ix = uVar7;
          }
          else {
            uVar16 = uVar13;
            if (bVar20 != bVar21) {
              bVar20 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar21];
              uVar16 = *storage_ix;
              *(ulong *)(storage + (uVar16 >> 3)) =
                   (ulong)kCodeLengthBits[bVar21] << ((byte)uVar16 & 7) |
                   (ulong)storage[uVar16 >> 3];
              *storage_ix = bVar20 + uVar16;
              uVar16 = uVar13 - 1;
            }
            if (2 < uVar16) {
              puVar24 = kCodeLengthBits + uVar16 + 0x11;
              puVar11 = (uint64_t *)(kNonZeroRepsDepth + uVar16 * 2 + 0x2ba);
              bVar20 = bVar21;
              goto LAB_00112f17;
            }
            if (uVar16 != 0) {
              bVar20 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar21];
              uVar23 = kCodeLengthBits[bVar21];
              uVar7 = *storage_ix;
              do {
                uVar18 = uVar7 >> 3;
                bVar3 = (byte)uVar7;
                uVar7 = uVar7 + bVar20;
                *(ulong *)(storage + uVar18) = (ulong)uVar23 << (bVar3 & 7) | (ulong)storage[uVar18]
                ;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
              goto LAB_00112f3f;
            }
          }
          uVar10 = uVar10 + uVar13;
          bVar20 = bVar21;
        } while (uVar10 < __n);
      }
    }
  }
  return;
}

Assistant:

void BrotliBuildAndStoreHuffmanTreeFast(MemoryManager* m,
                                        const uint32_t* histogram,
                                        const size_t histogram_total,
                                        const size_t max_bits,
                                        uint8_t* depth, uint16_t* bits,
                                        size_t* storage_ix,
                                        uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    depth[symbols[0]] = 0;
    bits[symbols[0]] = 0;
    return;
  }

  memset(depth, 0, length * sizeof(depth[0]));
  {
    const size_t max_tree_size = 2 * length + 1;
    HuffmanTree* tree = BROTLI_ALLOC(m, HuffmanTree, max_tree_size);
    uint32_t count_limit;
    if (BROTLI_IS_OOM(m)) return;
    for (count_limit = 1; ; count_limit *= 2) {
      HuffmanTree* node = tree;
      size_t l;
      for (l = length; l != 0;) {
        --l;
        if (histogram[l]) {
          if (BROTLI_PREDICT_TRUE(histogram[l] >= count_limit)) {
            InitHuffmanTree(node, histogram[l], -1, (int16_t)l);
          } else {
            InitHuffmanTree(node, count_limit, -1, (int16_t)l);
          }
          ++node;
        }
      }
      {
        const int n = (int)(node - tree);
        HuffmanTree sentinel;
        int i = 0;      /* Points to the next leaf node. */
        int j = n + 1;  /* Points to the next non-leaf node. */
        int k;

        SortHuffmanTreeItems(tree, (size_t)n, SortHuffmanTree);
        /* The nodes are:
           [0, n): the sorted leaf nodes that we start with.
           [n]: we add a sentinel here.
           [n + 1, 2n): new parent nodes are added here, starting from
                        (n+1). These are naturally in ascending order.
           [2n]: we add a sentinel at the end as well.
           There will be (2n+1) elements at the end. */
        InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
        *node++ = sentinel;
        *node++ = sentinel;

        for (k = n - 1; k > 0; --k) {
          int left, right;
          if (tree[i].total_count_ <= tree[j].total_count_) {
            left = i;
            ++i;
          } else {
            left = j;
            ++j;
          }
          if (tree[i].total_count_ <= tree[j].total_count_) {
            right = i;
            ++i;
          } else {
            right = j;
            ++j;
          }
          /* The sentinel node becomes the parent node. */
          node[-1].total_count_ =
              tree[left].total_count_ + tree[right].total_count_;
          node[-1].index_left_ = (int16_t)left;
          node[-1].index_right_or_value_ = (int16_t)right;
          /* Add back the last sentinel node. */
          *node++ = sentinel;
        }
        if (BrotliSetDepth(2 * n - 1, tree, depth, 14)) {
          /* We need to pack the Huffman tree in 14 bits. If this was not
             successful, add fake entities to the lowest values and retry. */
          break;
        }
      }
    }
    BROTLI_FREE(m, tree);
  }
  BrotliConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    size_t i;
    /* value of 1 indicates a simple Huffman code */
    BrotliWriteBits(2, 1, storage_ix, storage);
    BrotliWriteBits(2, count - 1, storage_ix, storage);  /* NSYM - 1 */

    /* Sort */
    for (i = 0; i < count; i++) {
      size_t j;
      for (j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          BROTLI_SWAP(size_t, symbols, j, i);
        }
      }
    }

    if (count == 2) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[3], storage_ix, storage);
      /* tree-select */
      BrotliWriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    uint8_t previous_value = 8;
    size_t i;
    /* Complex Huffman Tree */
    StoreStaticCodeLengthCode(storage_ix, storage);

    /* Actual RLE coding. */
    for (i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      size_t k;
      for (k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        BrotliWriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                        storage_ix, storage);
      } else {
        if (previous_value != value) {
          BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                          storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                            storage_ix, storage);
          }
        } else {
          reps -= 3;
          BrotliWriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                          storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}